

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

ImportInfo * __thiscall cmTarget::GetImportInfo(cmTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  ImportInfo *pIVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>_>,_bool>
  pVar4;
  string config_upper;
  ImportInfo info;
  value_type entry;
  key_type local_230;
  ImportInfo local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>
  local_128;
  
  if (this->IsImportedTarget == true) {
    paVar1 = &local_230.field_2;
    local_230._M_string_length = 0;
    local_230.field_2._M_local_buf[0] = '\0';
    local_230._M_dataplus._M_p = (pointer)paVar1;
    if (config->_M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_230,0,(char *)0x0,0x4c0f33);
    }
    else {
      cmsys::SystemTools::UpperCase(&local_128.first,config);
      std::__cxx11::string::operator=((string *)&local_230,(string *)&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.first._M_dataplus._M_p != &local_128.first.field_2) {
        operator_delete(local_128.first._M_dataplus._M_p,
                        local_128.first.field_2._M_allocated_capacity + 1);
      }
    }
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>_>_>
            ::find(&(((this->Internal).Pointer)->ImportInfoMap)._M_t,&local_230);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(((this->Internal).Pointer)->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header) {
      local_210.Location._M_dataplus._M_p = (pointer)&local_210.Location.field_2;
      local_210.NoSOName = false;
      local_210.Multiplicity = 0;
      local_210.Location._M_string_length = 0;
      local_210.Location.field_2._M_local_buf[0] = '\0';
      local_210.SOName._M_dataplus._M_p = (pointer)&local_210.SOName.field_2;
      local_210.SOName._M_string_length = 0;
      local_210.SOName.field_2._M_local_buf[0] = '\0';
      local_210.ImportLibrary._M_dataplus._M_p = (pointer)&local_210.ImportLibrary.field_2;
      local_210.ImportLibrary._M_string_length = 0;
      local_210.ImportLibrary.field_2._M_local_buf[0] = '\0';
      local_210.Languages._M_dataplus._M_p = (pointer)&local_210.Languages.field_2;
      local_210.Languages._M_string_length = 0;
      local_210.Languages.field_2._M_local_buf[0] = '\0';
      local_210.Libraries._M_dataplus._M_p = (pointer)&local_210.Libraries.field_2;
      local_210.Libraries._M_string_length = 0;
      local_210.Libraries.field_2._M_local_buf[0] = '\0';
      local_210.LibrariesProp._M_dataplus._M_p = (pointer)&local_210.LibrariesProp.field_2;
      local_210.LibrariesProp._M_string_length = 0;
      local_210.LibrariesProp.field_2._M_local_buf[0] = '\0';
      local_210.SharedDeps._M_dataplus._M_p = (pointer)&local_210.SharedDeps.field_2;
      local_210.SharedDeps._M_string_length = 0;
      local_210.SharedDeps.field_2._M_local_buf[0] = '\0';
      ComputeImportInfo(this,&local_230,&local_210);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmTarget::ImportInfo_&,_true>
                (&local_128,&local_230,&local_210);
      pVar4 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget::ImportInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmTarget::ImportInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::ImportInfo>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string_const,cmTarget::ImportInfo>&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget::ImportInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmTarget::ImportInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::ImportInfo>>>
                          *)&((this->Internal).Pointer)->ImportInfoMap,&local_128);
      iVar2._M_node = (_Base_ptr)pVar4.first._M_node;
      ImportInfo::~ImportInfo(&local_128.second);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.first._M_dataplus._M_p != &local_128.first.field_2) {
        operator_delete(local_128.first._M_dataplus._M_p,
                        local_128.first.field_2._M_allocated_capacity + 1);
      }
      ImportInfo::~ImportInfo(&local_210);
    }
    if (((this->TargetTypeValue == INTERFACE_LIBRARY) ||
        (iVar2._M_node[2]._M_left != (_Base_ptr)0x0)) ||
       (iVar2._M_node[4]._M_left != (_Base_ptr)0x0)) {
      pIVar3 = (ImportInfo *)(iVar2._M_node + 2);
    }
    else {
      pIVar3 = (ImportInfo *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                               local_230.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    pIVar3 = (ImportInfo *)0x0;
  }
  return pIVar3;
}

Assistant:

cmTarget::ImportInfo const*
cmTarget::GetImportInfo(const std::string& config) const
{
  // There is no imported information for non-imported targets.
  if(!this->IsImported())
    {
    return 0;
    }

  // Lookup/compute/cache the import information for this
  // configuration.
  std::string config_upper;
  if(!config.empty())
    {
    config_upper = cmSystemTools::UpperCase(config);
    }
  else
    {
    config_upper = "NOCONFIG";
    }
  typedef cmTargetInternals::ImportInfoMapType ImportInfoMapType;

  ImportInfoMapType::const_iterator i =
    this->Internal->ImportInfoMap.find(config_upper);
  if(i == this->Internal->ImportInfoMap.end())
    {
    ImportInfo info;
    this->ComputeImportInfo(config_upper, info);
    ImportInfoMapType::value_type entry(config_upper, info);
    i = this->Internal->ImportInfoMap.insert(entry).first;
    }

  if(this->GetType() == INTERFACE_LIBRARY)
    {
    return &i->second;
    }
  // If the location is empty then the target is not available for
  // this configuration.
  if(i->second.Location.empty() && i->second.ImportLibrary.empty())
    {
    return 0;
    }

  // Return the import information.
  return &i->second;
}